

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsViewPrivate::_q_unsetViewportCursor(QGraphicsViewPrivate *this)

{
  bool bVar1;
  QGraphicsItem *this_00;
  QGraphicsViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem *item;
  QList<QGraphicsItem_*> *__range1;
  QGraphicsView *q;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QGraphicsItem_*> items;
  QCursor *in_stack_ffffffffffffff58;
  QGraphicsViewPrivate *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  QGraphicsItem *pos;
  QGraphicsViewPrivate *this_01;
  QCursor local_60;
  QCursor local_58;
  QGraphicsItem **local_50;
  const_iterator local_48;
  const_iterator local_40;
  QPointF local_38;
  QPoint local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = (QGraphicsItem *)q_func(in_RDI);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  pos = this_00;
  QEventStorage<QMouseEvent>::operator->(&in_RDI->lastMouseEvent);
  local_38 = QSinglePointEvent::position((QSinglePointEvent *)0xa34c55);
  local_28 = QPointF::toPoint((QPointF *)this_00);
  QGraphicsView::items((QGraphicsView *)this_01,(QPoint *)pos);
  local_40.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = QList<QGraphicsItem_*>::begin((QList<QGraphicsItem_*> *)in_stack_ffffffffffffff60);
  local_48.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)in_stack_ffffffffffffff60);
  do {
    local_50 = local_48.i;
    bVar1 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_40,local_48);
    if (!bVar1) {
      if ((in_RDI->hasStoredOriginalCursor & 1U) != 0) {
        in_RDI->hasStoredOriginalCursor = false;
        if (in_RDI->dragMode == ScrollHandDrag) {
          QCursor::QCursor(&local_60,OpenHandCursor);
          QWidget::setCursor((QWidget *)
                             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                             (QCursor *)this_00);
          QCursor::~QCursor(&local_60);
        }
        else {
          QWidget::setCursor((QWidget *)
                             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                             (QCursor *)this_00);
        }
      }
LAB_00a34df6:
      QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0xa34e03);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    QList<QGraphicsItem_*>::const_iterator::operator*(&local_40);
    bVar1 = QGraphicsItem::isEnabled((QGraphicsItem *)0xa34d1a);
    if ((bVar1) && (bVar1 = QGraphicsItem::hasCursor((QGraphicsItem *)0xa34d2a), bVar1)) {
      QGraphicsItem::cursor(this_00);
      _q_setViewportCursor(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      QCursor::~QCursor(&local_58);
      goto LAB_00a34df6;
    }
    QList<QGraphicsItem_*>::const_iterator::operator++(&local_40);
  } while( true );
}

Assistant:

void QGraphicsViewPrivate::_q_unsetViewportCursor()
{
    Q_Q(QGraphicsView);
    const auto items = q->items(lastMouseEvent->position().toPoint());
    for (QGraphicsItem *item : items) {
        if (item->isEnabled() && item->hasCursor()) {
            _q_setViewportCursor(item->cursor());
            return;
        }
    }

    // Restore the original viewport cursor.
    if (hasStoredOriginalCursor) {
        hasStoredOriginalCursor = false;
        if (dragMode == QGraphicsView::ScrollHandDrag)
            viewport->setCursor(Qt::OpenHandCursor);
        else
            viewport->setCursor(originalCursor);
    }
}